

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

TimeLevel __thiscall amrex::AmrLevel::which_time(AmrLevel *this,int indx,Real time)

{
  StateData *this_00;
  double in_XMM0_Qa;
  Real RVar1;
  Real RVar2;
  Real RVar3;
  double dVar4;
  Real RVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Real epsilon;
  Real tqtime;
  Real qtime;
  Real haftime;
  Real newtime;
  Real oldtime;
  size_type in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  StateData *in_stack_ffffffffffffff80;
  StateData *in_stack_ffffffffffffff90;
  undefined4 local_4;
  
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  RVar1 = StateData::prevTime(in_stack_ffffffffffffff80);
  this_00 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                      ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                       CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
  RVar2 = StateData::curTime(in_stack_ffffffffffffff90);
  RVar3 = literals::operator____rt((literals *)this_00,(longdouble)0.5);
  dVar4 = RVar3 * (RVar1 + RVar2);
  RVar3 = RVar1;
  RVar5 = literals::operator____rt((literals *)this_00,(longdouble)0.25);
  dVar6 = RVar5 * (RVar2 - RVar1) + RVar3;
  RVar3 = RVar1;
  RVar5 = literals::operator____rt((literals *)this_00,(longdouble)0.75);
  dVar7 = RVar5 * (RVar2 - RVar1) + RVar3;
  RVar3 = literals::operator____rt((literals *)this_00,_DAT_016afc00);
  dVar8 = RVar3 * (RVar2 - RVar1);
  if ((in_XMM0_Qa < RVar1 - dVar8) || (RVar1 + dVar8 < in_XMM0_Qa)) {
    if ((in_XMM0_Qa < RVar2 - dVar8) || (RVar2 + dVar8 < in_XMM0_Qa)) {
      if ((in_XMM0_Qa < dVar4 - dVar8) || (dVar4 + dVar8 < in_XMM0_Qa)) {
        if ((in_XMM0_Qa < dVar6 - dVar8) || (dVar6 + dVar8 < in_XMM0_Qa)) {
          if ((in_XMM0_Qa < dVar7 - dVar8) || (dVar7 + dVar8 < in_XMM0_Qa)) {
            local_4 = AmrOtherTime;
          }
          else {
            local_4 = Amr3QtrTime;
          }
        }
        else {
          local_4 = Amr1QtrTime;
        }
      }
      else {
        local_4 = AmrHalfTime;
      }
    }
    else {
      local_4 = AmrNewTime;
    }
  }
  else {
    local_4 = AmrOldTime;
  }
  return local_4;
}

Assistant:

AmrLevel::TimeLevel
AmrLevel::which_time (int  indx, Real time) const noexcept
{
    const Real oldtime = state[indx].prevTime();
    const Real newtime = state[indx].curTime();
    const Real haftime = .5_rt * (oldtime + newtime);
    const Real qtime = oldtime + 0.25_rt*(newtime-oldtime);
    const Real tqtime = oldtime + 0.75_rt*(newtime-oldtime);
    const Real epsilon = 0.001_rt * (newtime - oldtime);

    BL_ASSERT(time >= oldtime-epsilon && time <= newtime+epsilon);

    if (time >= oldtime-epsilon && time <= oldtime+epsilon)
    {
        return AmrOldTime;
    }
    else if (time >= newtime-epsilon && time <= newtime+epsilon)
    {
        return AmrNewTime;
    }
    else if (time >= haftime-epsilon && time <= haftime+epsilon)
    {
        return AmrHalfTime;
    }
    else if (time >= qtime-epsilon && time <= qtime+epsilon)
    {
        return Amr1QtrTime;
    }
    else if (time >= tqtime-epsilon && time <= tqtime+epsilon)
    {
        return Amr3QtrTime;
    }
    return AmrOtherTime;
}